

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

ReceiverStatistics __thiscall
tonk::ReceiverBandwidthControl::GetStatistics(ReceiverBandwidthControl *this)

{
  ReceiverStatistics RVar1;
  long in_RDI;
  ReceiverStatistics stats;
  ReceiverStatistics local_c;
  
  ReceiverStatistics::ReceiverStatistics(&local_c);
  RVar1.LossRate = (float)*(undefined4 *)(in_RDI + 0x28);
  RVar1.GoodputBPS = *(undefined4 *)(in_RDI + 0x18);
  RVar1.TripUsec = *(uint *)(in_RDI + 0x24);
  return RVar1;
}

Assistant:

ReceiverStatistics ReceiverBandwidthControl::GetStatistics() const
{
    ReceiverStatistics stats;
    stats.GoodputBPS = Bandwidth.Measurement.SmoothedGoodputBPS;

    // This must be the minimum so that the bandwidth controller on the other side uses a
    // minimum OWD to base RTT estimate on when planning to flush the bottleneck router queue.
    // If we over-estimate the RTT, then we may not fully flush before the next probe.
    // If we under-estimate the RTT, then we will not cause any issues.
    stats.TripUsec = Bandwidth.Measurement.SmoothedMinTripUsec;

    stats.LossRate = Bandwidth.Measurement.SmoothedPLR;
    return stats;
}